

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

size_t __thiscall re2::DFA::StateHash::operator()(StateHash *this,State *a)

{
  int len;
  char *s;
  State *a_local;
  StateHash *this_local;
  
  if (a == (State *)0x0) {
    this_local = (StateHash *)0x0;
  }
  else {
    this_local = (StateHash *)Hash64StringWithSeed((char *)a->inst_,a->ninst_ << 2,a->flag_);
  }
  return (size_t)this_local;
}

Assistant:

size_t operator()(const State* a) const {
      if (a == NULL)
        return 0;
      const char* s = reinterpret_cast<const char*>(a->inst_);
      int len = a->ninst_ * sizeof a->inst_[0];
      if (sizeof(size_t) == sizeof(uint32))
        return Hash32StringWithSeed(s, len, a->flag_);
      else
        return static_cast<size_t>(Hash64StringWithSeed(s, len, a->flag_));
    }